

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkServerTest.cpp
# Opt level: O0

void __thiscall MyServerConnection::MyServerConnection(MyServerConnection *this,MyServer *server)

{
  SDKConnection *in_RSI;
  undefined8 *in_RDI;
  
  tonk::SDKConnection::SDKConnection(in_RSI);
  *in_RDI = &PTR__MyServerConnection_00128ab8;
  *(undefined4 *)(in_RDI + 6) = 0;
  *(undefined1 *)((long)in_RDI + 0x34) = 0;
  in_RDI[7] = in_RSI;
  test::OWDTimeStatistics::OWDTimeStatistics((OWDTimeStatistics *)(in_RDI + 8));
  in_RDI[0x3f1] = 0;
  *(undefined4 *)(in_RDI + 0x3f2) = 0;
  *(undefined4 *)((long)in_RDI + 0x1f94) = 0;
  return;
}

Assistant:

MyServerConnection(MyServer* server)
        : Server(server)
    {}